

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_sl.c
# Opt level: O1

uint64_t sylvan_skiplist_get(sylvan_skiplist_t l,MTBDD dd)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar5;
  uint uVar6;
  uint64_t in_R8;
  uint64_t uVar4;
  
  uVar5 = 0;
  if ((dd & 0x7fffffffffffffff) == 0) {
    return 0;
  }
  uVar6 = 0xd;
  do {
    uVar3 = l->buckets[uVar5].next[uVar6].super___atomic_base<unsigned_int>._M_i & 0x7fffffff;
    uVar4 = (uint64_t)uVar3;
    if (uVar3 == 0) {
LAB_00113c1b:
      if (uVar6 != 0) {
        uVar6 = uVar6 - 1;
        goto LAB_00113c24;
      }
      uVar6 = 0;
      uVar4 = 0;
LAB_00113c2d:
      bVar2 = false;
    }
    else {
      uVar1 = l->buckets[uVar4].dd;
      if (uVar1 == dd) goto LAB_00113c2d;
      if (dd <= uVar1) goto LAB_00113c1b;
      uVar5 = (ulong)uVar3;
LAB_00113c24:
      bVar2 = true;
      uVar4 = in_R8;
    }
    in_R8 = uVar4;
    if (!bVar2) {
      return uVar4;
    }
  } while( true );
}

Assistant:

uint64_t
sylvan_skiplist_get(sylvan_skiplist_t l, MTBDD dd)
{
    if (dd == mtbdd_false || dd == mtbdd_true) return 0;

    uint32_t loc = 0, k = SL_DEPTH-1;
    for (;;) {
        /* invariant: [loc].dd < dd */
        /* note: this is always true for loc==0 */
        sl_bucket *e = l->buckets + loc;
        uint32_t loc_next = atomic_load_explicit(e->next+k, memory_order_acquire) & 0x7fffffff;
        if (loc_next != 0 && l->buckets[loc_next].dd == dd) {
            /* found */
            return loc_next;
        } else if (loc_next != 0 && l->buckets[loc_next].dd < dd) {
            /* go right */
            loc = loc_next;
        } else if (k > 0) {
            /* go down */
            k--;
        } else {
            return 0;
        }
    }
}